

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcPart.c
# Opt level: O3

int Abc_NtkPartitionSmartFindPart
              (Vec_Ptr_t *vPartSuppsAll,Vec_Ptr_t *vPartsAll,Vec_Ptr_t *vPartSuppsChar,
              int nSuppSizeLimit,Vec_Int_t *vOne)

{
  uint uVar1;
  bool bVar2;
  uint uVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int local_40;
  uint uVar10;
  
  if ((long)vPartSuppsAll->nSize < 1) {
    local_40 = -1;
  }
  else {
    uVar4 = 0;
    uVar6 = (ulong)(uint)vPartSuppsChar->nSize;
    if (vPartSuppsChar->nSize < 1) {
      uVar6 = uVar4;
    }
    local_40 = -1;
    iVar7 = 0;
    do {
      if (uVar4 == uVar6) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      uVar1 = vOne->nSize;
      if (0 < (long)(int)uVar1) {
        lVar5 = 0;
        uVar3 = 0;
        do {
          uVar3 = uVar3 + ((*(uint *)((long)vPartSuppsChar->pArray[uVar4] +
                                     (long)(vOne->pArray[lVar5] >> 5) * 4) >>
                            (vOne->pArray[lVar5] & 0x1fU) & 1) != 0);
          lVar5 = lVar5 + 1;
        } while ((int)uVar1 != lVar5);
        if (uVar3 != 0) {
          if (uVar3 == uVar1) {
            return (int)uVar4;
          }
          iVar8 = *(int *)((long)vPartSuppsAll->pArray[uVar4] + 4);
          if ((nSuppSizeLimit < 1) || (iVar8 < nSuppSizeLimit * 2)) {
            iVar9 = 1;
            if (99 < iVar8) {
              uVar10 = 0x1f;
              if (iVar8 - 0x65U != 0) {
                for (; iVar8 - 0x65U >> uVar10 == 0; uVar10 = uVar10 - 1) {
                }
              }
              uVar10 = (uVar10 ^ 0xffffffe0) + 0x21;
              if (iVar8 - 100U < 2) {
                uVar10 = iVar8 - 100U;
              }
              iVar9 = uVar10 + 1;
            }
            iVar9 = (int)((uVar3 * 1000) / uVar1) / iVar9;
            iVar8 = iVar7;
            if (iVar7 <= iVar9) {
              iVar8 = iVar9;
            }
            bVar2 = iVar7 < iVar9;
            iVar7 = iVar8;
            if (bVar2) {
              local_40 = (int)uVar4;
            }
          }
        }
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 != (long)vPartSuppsAll->nSize);
    if (iVar7 < 0x4b) {
      local_40 = -1;
    }
  }
  return local_40;
}

Assistant:

int Abc_NtkPartitionSmartFindPart( Vec_Ptr_t * vPartSuppsAll, Vec_Ptr_t * vPartsAll, Vec_Ptr_t * vPartSuppsChar, int nSuppSizeLimit, Vec_Int_t * vOne )
{
/*
    Vec_Int_t * vPartSupp, * vPart;
    double Attract, Repulse, Cost, CostBest;
    int i, nCommon, iBest;
    iBest = -1;
    CostBest = 0.0;
    Vec_PtrForEachEntry( Vec_Int_t *, vPartSuppsAll, vPartSupp, i )
    {
        vPart = Vec_PtrEntry( vPartsAll, i );
        if ( nPartSizeLimit > 0 && Vec_IntSize(vPart) >= nPartSizeLimit )
            continue;
        nCommon = Vec_IntTwoCountCommon( vPartSupp, vOne );
        if ( nCommon == 0 )
            continue;
        if ( nCommon == Vec_IntSize(vOne) )
            return i;
        Attract = 1.0 * nCommon / Vec_IntSize(vOne);
        if ( Vec_IntSize(vPartSupp) < 100 )
            Repulse = 1.0;
        else
            Repulse = log10( Vec_IntSize(vPartSupp) / 10.0 );
        Cost = pow( Attract, pow(Repulse, 5.0) );
        if ( CostBest < Cost )
        {
            CostBest = Cost;
            iBest = i;
        }
    }
    if ( CostBest < 0.6 )
        return -1;
    return iBest;
*/

    Vec_Int_t * vPartSupp;//, * vPart;
    int Attract, Repulse, Value, ValueBest;
    int i, nCommon, iBest;
//    int nCommon2;
    iBest = -1;
    ValueBest = 0;
    Vec_PtrForEachEntry( Vec_Int_t *, vPartSuppsAll, vPartSupp, i )
    {
        // skip partitions with too many outputs
//        vPart = Vec_PtrEntry( vPartsAll, i );
//        if ( nSuppSizeLimit > 0 && Vec_IntSize(vPart) >= nSuppSizeLimit )
//            continue;
        // find the number of common variables between this output and the partitions
//        nCommon2 = Vec_IntTwoCountCommon( vPartSupp, vOne );
        nCommon = Abc_NtkSuppCharCommon( (unsigned *)Vec_PtrEntry(vPartSuppsChar, i), vOne );
//        assert( nCommon2 == nCommon );
        // if no common variables, continue searching
        if ( nCommon == 0 )
            continue;
        // if all variables are common, the best partition if found
        if ( nCommon == Vec_IntSize(vOne) )
            return i;
        // skip partitions whose size exceeds the limit
        if ( nSuppSizeLimit > 0 && Vec_IntSize(vPartSupp) >= 2 * nSuppSizeLimit )
            continue;
        // figure out might be the good partition for this one
        Attract = 1000 * nCommon / Vec_IntSize(vOne);
        if ( Vec_IntSize(vPartSupp) < 100 )
            Repulse = 1;
        else
            Repulse = 1+Abc_Base2Log(Vec_IntSize(vPartSupp)-100);
        Value = Attract/Repulse;
        if ( ValueBest < Value )
        {
            ValueBest = Value;
            iBest = i;
        }
    }
    if ( ValueBest < 75 )
        return -1;
    return iBest;
}